

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O3

void andyzip::brotli_decoder::read_huffman_code<andyzip::huffman_table<258>>
               (brotli_decoder_state *s,huffman_table<258> *table,int alphabet_size)

{
  EVP_PKEY_CTX EVar1;
  ushort uVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  byte bVar6;
  sbyte sVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint32_t uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  huffman_table<18> complex_table;
  uint16_t symbols [258];
  uint local_2d4;
  huffman_table<18> local_2a8;
  EVP_PKEY_CTX local_238 [16];
  undefined2 local_228;
  
  uVar12 = s->bitptr;
  pcVar3 = s->src;
  uVar11 = *(uint *)(pcVar3 + (uVar12 >> 3));
  uVar15 = uVar12 + 2;
  s->bitptr = uVar15;
  if (s->error == ok) {
    uVar14 = uVar11 >> ((byte)uVar12 & 7) & 3;
    uVar17 = (ulong)uVar14;
    uVar11 = alphabet_size & 0x3ff;
    if (uVar14 == 1) {
      uVar15 = *(uint *)(pcVar3 + (uVar15 >> 3)) >> ((byte)uVar15 & 7) & 3;
      uVar12 = uVar12 + 4;
      s->bitptr = uVar12;
      iVar5 = 0;
      uVar11 = uVar11 - 1;
      if (uVar11 != 0) {
        do {
          iVar5 = iVar5 + 1;
          bVar4 = 1 < uVar11;
          uVar11 = (int)uVar11 >> 1;
        } while (bVar4);
      }
      uVar17 = (ulong)uVar15;
      lVar10 = 0;
      do {
        uVar11 = *(uint *)(pcVar3 + (uVar12 >> 3));
        bVar6 = (byte)uVar12;
        uVar12 = uVar12 + iVar5;
        s->bitptr = uVar12;
        *(ushort *)(local_238 + lVar10 * 2) =
             (ushort)(uVar11 >> (bVar6 & 7)) & ~(ushort)(-1 << ((byte)iVar5 & 0x1f));
        lVar10 = lVar10 + 1;
      } while (uVar17 + 1 != lVar10);
      if (uVar15 == 3) {
        uVar15 = *(uint *)(pcVar3 + (uVar12 >> 3));
        s->bitptr = uVar12 + 1;
        uVar17 = (ulong)(((uVar15 >> (uVar12 & 7) & 1) != 0) + 3);
      }
      huffman_table<258>::init
                (table,(EVP_PKEY_CTX *)
                       (read_huffman_code<andyzip::huffman_table<258>_>::simple_lengths + uVar17));
    }
    else {
      local_238[0] = (EVP_PKEY_CTX)0x0;
      local_238[1] = (EVP_PKEY_CTX)0x0;
      local_238[2] = (EVP_PKEY_CTX)0x0;
      local_238[3] = (EVP_PKEY_CTX)0x0;
      local_238[4] = (EVP_PKEY_CTX)0x0;
      local_238[5] = (EVP_PKEY_CTX)0x0;
      local_238[6] = (EVP_PKEY_CTX)0x0;
      local_238[7] = (EVP_PKEY_CTX)0x0;
      local_238[8] = (EVP_PKEY_CTX)0x0;
      local_238[9] = (EVP_PKEY_CTX)0x0;
      local_238[10] = (EVP_PKEY_CTX)0x0;
      local_238[0xb] = (EVP_PKEY_CTX)0x0;
      local_238[0xc] = (EVP_PKEY_CTX)0x0;
      local_238[0xd] = (EVP_PKEY_CTX)0x0;
      local_238[0xe] = (EVP_PKEY_CTX)0x0;
      local_238[0xf] = (EVP_PKEY_CTX)0x0;
      local_228 = 0;
      iVar13 = 0;
      iVar5 = 0;
      do {
        uVar12 = *(uint *)(pcVar3 + (uVar15 >> 3)) >> ((byte)uVar15 & 7) & 0xf;
        uVar15 = "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar12] + uVar15
        ;
        s->bitptr = uVar15;
        EVar1 = *(EVP_PKEY_CTX *)("" + uVar12);
        local_238["\x01\x02\x03\x04"[uVar17]] = EVar1;
        if ((0x1111U >> uVar12 & 1) == 0) {
          iVar5 = iVar5 + 1;
          iVar13 = iVar13 + (0x20U >> ((byte)EVar1 & 0x1f));
          if (0x1f < iVar13) break;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 0x12);
      if ((iVar5 == 1) || (iVar13 == 0x20)) {
        iVar5 = 0;
        huffman_table<18>::init(&local_2a8,local_238);
        if (local_2a8.invalid_ == false) {
          iVar13 = 0;
          if (uVar11 != 0) {
            pcVar3 = s->src;
            uVar20 = s->bitptr;
            local_2d4 = 8;
            iVar13 = 0;
            uVar15 = 0;
            iVar5 = 0;
            do {
              iVar8 = 0;
              while( true ) {
                uVar14 = *(uint *)(pcVar3 + (uVar20 >> 3)) >> ((byte)uVar20 & 7);
                iVar16 = (1 - (uint)local_2a8.min_length_) - uVar20;
                uVar12 = 0;
                do {
                  uVar18 = uVar12;
                  iVar16 = iVar16 + -1;
                  uVar12 = uVar18 + 1;
                } while (local_2a8.limits_[uVar18] <
                         CONCAT11(rev16(unsigned_short)::BitReverseTable256[uVar14 & 0xff],
                                  rev16(unsigned_short)::BitReverseTable256[uVar14 >> 8 & 0xff]));
                uVar2 = local_2a8.symbols_
                        [(uint)(ushort)(CONCAT11(rev16(unsigned_short)::BitReverseTable256
                                                 [uVar14 & 0xff],
                                                 rev16(unsigned_short)::BitReverseTable256
                                                 [uVar14 >> 8 & 0xff]) >>
                                       (('\x11' - local_2a8.min_length_) - (char)(uVar18 + 1) & 0x1f
                                       )) - (uint)local_2a8.base_[uVar18]];
                uVar20 = -iVar16;
                s->bitptr = uVar20;
                uVar12 = (uint)uVar2;
                if (uVar2 < 0x10) break;
                uVar14 = 0;
                if (uVar12 == 0x10) {
                  uVar14 = local_2d4;
                }
                uVar12 = uVar12 == 0x10 ^ 3;
                sVar7 = (sbyte)uVar12;
                uVar18 = ~(-1 << sVar7) & *(uint *)(pcVar3 + (uVar20 >> 3)) >> ((byte)uVar20 & 7);
                uVar20 = uVar12 - iVar16;
                s->bitptr = uVar20;
                if (uVar15 != uVar14) {
                  iVar8 = 0;
                }
                iVar16 = iVar8 + -2 << sVar7;
                if (iVar8 < 1) {
                  iVar16 = iVar8;
                }
                iVar19 = iVar16 + uVar18 + 3;
                iVar9 = iVar19 - iVar8;
                if ((int)uVar11 < iVar9 + iVar13) goto LAB_00104a67;
                if (iVar19 != iVar8) {
                  memset(local_238 + iVar13,uVar14,(ulong)(((iVar16 + uVar18) - iVar8) + 2) + 1);
                  auVar24._8_4_ = 0xffffffff;
                  auVar24._0_8_ = 0xffffffffffffffff;
                  auVar24._12_4_ = 0xffffffff;
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = (long)iVar13;
                  iVar13 = 2;
                  do {
                    auVar22 = auVar21;
                    auVar21._0_8_ = auVar22._0_8_ + 1;
                    auVar21._8_8_ = auVar22._8_8_ - auVar24._8_8_;
                    iVar8 = iVar13 + -2;
                    iVar16 = iVar13 + (iVar9 + 1U & 0xfffffffe);
                    iVar13 = iVar8;
                  } while (iVar16 != 4);
                  uVar15 = -iVar8;
                  iVar13 = -(uint)((int)(iVar9 - 1U ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
                  iVar8 = -(uint)((int)(iVar9 - 1U ^ 0x80000000) < (int)((uVar15 | 1) ^ 0x80000000))
                  ;
                  auVar23._4_4_ = iVar13;
                  auVar23._0_4_ = iVar13;
                  auVar23._8_4_ = iVar8;
                  auVar23._12_4_ = iVar8;
                  auVar21 = ~auVar23 & auVar21 | auVar22 & auVar23;
                  iVar13 = auVar21._8_4_ + auVar21._0_4_;
                }
                iVar9 = iVar9 * (0x8000U >> ((byte)uVar14 & 0x1f));
                if (uVar14 == 0) {
                  iVar9 = 0;
                }
                iVar5 = iVar5 + iVar9;
                if (((int)uVar11 <= iVar13) || (uVar15 = uVar14, iVar8 = iVar19, 0x7fff < iVar5))
                goto LAB_00104a21;
              }
              local_238[iVar13] = SUB21(uVar2,0);
              iVar13 = iVar13 + 1;
              if (uVar2 != 0) {
                local_2d4 = uVar12;
                uVar12 = 0x8000 >> ((byte)SUB21(uVar2,0) & 0x1f);
              }
              iVar5 = uVar12 + iVar5;
            } while ((iVar13 < (int)uVar11) && (iVar5 < 0x8000));
          }
LAB_00104a21:
          if (iVar5 < 0x8001) {
            memset(local_238 + iVar13,0,(long)(int)(uVar11 - iVar13));
            huffman_table<258>::init(table,local_238);
            if (table->invalid_ != true) {
              return;
            }
          }
        }
      }
LAB_00104a67:
      s->error = huffman_length_error;
    }
  }
  return;
}

Assistant:

static void read_huffman_code(brotli_decoder_state &s, Table &table, int alphabet_size) {
      int code_type = s.read(2);
      if (s.error != error_code::ok) return;
      alphabet_size &= 1023;
      if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->sub_loop_counter = %d\n", code_type);
      if (code_type == 1) {
        // 3.4.  Simple Prefix Codes
        int num_symbols = s.read(2) + 1;
        int alphabet_bits = log2_floor(alphabet_size - 1);
        uint16_t symbols[Table::max_codes];
        for (int i = 0; i != num_symbols; ++i) {
          symbols[i] = (uint16_t)s.read(alphabet_bits);
          if (debug) fprintf(s.log_file, "[ReadSimpleHuffmanSymbols] s->symbols_lists_array[i] = %d\n", symbols[i]);
        }
        if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->symbol = %d\n", num_symbols-1);
        static const uint8_t simple_lengths[][4] = {
          {0},
          {1, 1},
          {1, 2, 2},
          {2, 2, 2, 2},
          {1, 2, 3, 3},
        };
        int tree_select = num_symbols == 4 ? s.read(1) : 0;
        table.init(simple_lengths[num_symbols - 1 + tree_select], symbols, num_symbols);
      } else {
        // 3.5.  Complex Prefix Codes
        andyzip::huffman_table<18> complex_table;
        {
          uint8_t lengths[18] = {0};
          int space = 0;
          int num_codes = 0;
          for (int i = code_type; i != 18; ++i) {
            int bits = s.peek(4);
            if (s.error != error_code::ok) return;

            static const uint8_t kCodeLengthCodeOrder[18] = {
              1, 2, 3, 4, 0, 5, 17, 6, 16, 7, 8, 9, 10, 11, 12, 13, 14, 15,
            };

            // Static prefix code for the complex code length code lengths.
            static const uint8_t kCodeLengthPrefixLength[16] = {
              2, 2, 2, 3, 2, 2, 2, 4, 2, 2, 2, 3, 2, 2, 2, 4,
            };

            static const uint8_t kCodeLengthPrefixValue[16] = {
              0, 4, 3, 2, 0, 4, 3, 1, 0, 4, 3, 2, 0, 4, 3, 5,
            };

            s.drop(kCodeLengthPrefixLength[bits]);
            uint8_t length = kCodeLengthPrefixValue[bits];
            lengths[kCodeLengthCodeOrder[i]] = length;
            if (debug) fprintf(s.log_file, "[ReadCodeLengthCodeLengths] s->code_length_code_lengths[%d] = %d\n", kCodeLengthCodeOrder[i], lengths[kCodeLengthCodeOrder[i]]);
            if (length) {
              ++num_codes;
              space += 32 >> length;
              if (space >= 32) break;
            }
          }
          if (num_codes != 1 && space != 32) {
            if (debug) fprintf(s.log_file, "bad\n");
            s.error = error_code::huffman_length_error;
            return;
          }

          complex_table.init(lengths, nullptr, 18);
          if (complex_table.invalid()) {
            if (debug) fprintf(s.log_file, "bad2\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }

        {
          int space = 0;
          uint8_t lengths[Table::max_codes];
          uint8_t nzcl = 8;
          int prev_code_len = 8;
          int repeat = 0;
          int repeat_code_len = 0;
          int i = 0;
          for(; i < alphabet_size && space < 32768;) {
            auto code = complex_table.decode(s.peek(16));
            s.drop(code.first);
            int code_len = code.second;
            if (code_len < 16) {
              if (code_len) {
                if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d] = %d\n", i, code_len);
              }
              if (i + 1 > alphabet_size) {
                s.error = error_code::huffman_length_error;
                if (debug) fprintf(s.log_file, "bad3\n");
                return;
              }
              lengths[i++] = (uint8_t)code_len;
              if (code_len) {
                space += 32768 >> code_len;
                prev_code_len = code_len;
              }
              repeat = 0;
            } else {
              int extra_bits = code_len == 16 ? 2 : 3;
              int new_len = code_len == 16 ? prev_code_len : 0;
              int repeat_delta = s.peek(extra_bits);
              s.drop(extra_bits);

              if (repeat_code_len != new_len) {
                repeat = 0;
                repeat_code_len = new_len;
              }

              int old_repeat = repeat;
              if (repeat > 0) {
                repeat -= 2;
                repeat <<= extra_bits;
              }

              repeat += repeat_delta + 3;
              repeat_delta = repeat - old_repeat;

              if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d..%d] = %d\n", i, i + repeat_delta - 1, new_len);
              if (i + repeat_delta > alphabet_size) {
                if (debug) fprintf(s.log_file, "bad4 %d %d %d\n", i, repeat_delta, alphabet_size);
                s.error = error_code::huffman_length_error;
                return;
              }
              for (int j = 0; j != repeat_delta; ++j) {
                lengths[i++] = new_len;
              }
              if (new_len) {
                space += (32768 >> new_len) * repeat_delta;
              }
            }
          }
          if (space > 32768) {
            if (debug) fprintf(s.log_file, "bad5\n");
            s.error = error_code::huffman_length_error;
            return;
          }
          memset(lengths + i, 0, alphabet_size - i);
          table.init(lengths, nullptr, alphabet_size);
          if (table.invalid()) {
            if (debug) fprintf(s.log_file, "bad6\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }
      }
    }